

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O1

int ply_write_header(p_ply ply)

{
  p_ply_element ptVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  iVar3 = fprintf((FILE *)ply->fp,"ply\nformat %s 1.0\n",ply_storage_mode_list[ply->storage_mode]);
  if (iVar3 < 1) {
LAB_0050c614:
    ply_ferror(ply,"Error writing to file");
    uVar4 = 0;
  }
  else {
    if (0 < ply->ncomments) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        iVar3 = fprintf((FILE *)ply->fp,"comment %s\n",ply->comment + lVar6);
        if (iVar3 < 1) goto LAB_0050c614;
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x400;
      } while (lVar7 < ply->ncomments);
    }
    if (0 < ply->nobj_infos) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        iVar3 = fprintf((FILE *)ply->fp,"obj_info %s\n",ply->obj_info + lVar6);
        if (iVar3 < 1) goto LAB_0050c614;
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x400;
      } while (lVar7 < ply->nobj_infos);
    }
    if (0 < ply->nelements) {
      lVar6 = 0;
      do {
        ptVar1 = ply->element + lVar6;
        iVar3 = fprintf((FILE *)ply->fp,"element %s %ld\n",ptVar1);
        if (iVar3 < 1) goto LAB_0050c614;
        if (0 < ptVar1->nproperties) {
          lVar7 = 0;
          lVar8 = 0;
          do {
            uVar5 = (ulong)*(uint *)((long)&ptVar1->property->type + lVar7);
            if (uVar5 == 0x10) {
              iVar3 = fprintf((FILE *)ply->fp,"property list %s %s %s\n",
                              ply_type_list[*(uint *)((long)&ptVar1->property->length_type + lVar7)]
                             );
            }
            else {
              iVar3 = fprintf((FILE *)ply->fp,"property %s %s\n",ply_type_list[uVar5]);
            }
            bVar2 = iVar3 < 1;
            if (bVar2) goto LAB_0050c5e8;
            lVar8 = lVar8 + 1;
            lVar7 = lVar7 + 0x128;
          } while (lVar8 < ptVar1->nproperties);
          bVar2 = false;
LAB_0050c5e8:
          if (bVar2) goto LAB_0050c614;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < ply->nelements);
    }
    iVar3 = fprintf((FILE *)ply->fp,"end_header\n");
    uVar4 = (uint)(0 < iVar3);
  }
  return uVar4;
}

Assistant:

int ply_write_header(p_ply ply) {
    long i, j;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(ply->element || ply->nelements == 0);
    assert(!ply->element || ply->nelements > 0);
    if (fprintf(ply->fp, "ply\nformat %s 1.0\n",
                ply_storage_mode_list[ply->storage_mode]) <= 0)
        goto error;
    for (i = 0; i < ply->ncomments; i++)
        if (fprintf(ply->fp, "comment %s\n", ply->comment + LINESIZE * i) <= 0)
            goto error;
    for (i = 0; i < ply->nobj_infos; i++)
        if (fprintf(ply->fp, "obj_info %s\n", ply->obj_info + LINESIZE * i) <=
            0)
            goto error;
    for (i = 0; i < ply->nelements; i++) {
        p_ply_element element = &ply->element[i];
        assert(element->property || element->nproperties == 0);
        assert(!element->property || element->nproperties > 0);
        if (fprintf(ply->fp, "element %s %ld\n", element->name,
                    element->ninstances) <= 0)
            goto error;
        for (j = 0; j < element->nproperties; j++) {
            p_ply_property property = &element->property[j];
            if (property->type == PLY_LIST) {
                if (fprintf(ply->fp, "property list %s %s %s\n",
                            ply_type_list[property->length_type],
                            ply_type_list[property->value_type],
                            property->name) <= 0)
                    goto error;
            } else {
                if (fprintf(ply->fp, "property %s %s\n",
                            ply_type_list[property->type], property->name) <= 0)
                    goto error;
            }
        }
    }
    return fprintf(ply->fp, "end_header\n") > 0;
error:
    ply_ferror(ply, "Error writing to file");
    return 0;
}